

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O3

void __thiscall
FileForJUnitOutputTests::FileForJUnitOutputTests
          (FileForJUnitOutputTests *this,SimpleString *filename,FileForJUnitOutputTests *next)

{
  SimpleString::SimpleString(&this->name_,filename);
  this->isOpen_ = true;
  SimpleString::SimpleString(&this->buffer_,"");
  this->next_ = next;
  SimpleStringCollection::SimpleStringCollection(&this->linesOfFile_);
  return;
}

Assistant:

FileForJUnitOutputTests(const SimpleString& filename, FileForJUnitOutputTests* next) :
        name_(filename), isOpen_(true), next_(next) {}